

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::anon_unknown_6::TileBufferTask::execute(TileBufferTask *this)

{
  pointer pTVar1;
  TileBuffer *pTVar2;
  Data *pDVar3;
  pointer pTVar4;
  size_t xStride;
  uint *puVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  int y;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  size_t numPixels;
  Box2i tileRange;
  char *writePtr;
  char *readPtr;
  char *compPtr;
  char *local_48 [2];
  int local_38;
  int local_34;
  
  pTVar2 = this->_tileBuffer;
  writePtr = (char *)(pTVar2->sampleCount)._sizeY;
  pDVar3 = this->_ofd;
  Imf_3_2::dataWindowForTile
            ((Imf_3_2 *)&tileRange,&pDVar3->tileDesc,pDVar3->minX,pDVar3->maxX,pDVar3->minY,
             pDVar3->maxY,(int)pTVar2->dataSize,*(int *)((long)&pTVar2->dataSize + 4),
             (int)pTVar2->uncompressedDataSize,*(int *)((long)&pTVar2->uncompressedDataSize + 4));
  iVar7 = tileRange.max.y - tileRange.min.y;
  lVar10 = (long)tileRange.max.x;
  lVar8 = (long)tileRange.min.x;
  numPixels = (size_t)((int)(lVar10 - lVar8) + 1);
  for (iVar9 = tileRange.min.y; iVar9 <= tileRange.max.y; iVar9 = iVar9 + 1) {
    uVar11 = 0;
    while( true ) {
      uVar12 = (ulong)uVar11;
      pDVar3 = this->_ofd;
      pTVar4 = (pDVar3->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pDVar3->slices).
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x30) <=
          uVar12) break;
      pTVar1 = pTVar4 + uVar12;
      if (pTVar4[uVar12].zero == true) {
        fillChannelWithZeroes(&writePtr,pDVar3->format,pTVar1->type,numPixels);
      }
      else {
        xStride = pTVar1->xStride;
        readPtr = pTVar1->base +
                  (long)(iVar9 - tileRange.min.y * pTVar1->yTileCoords) * pTVar1->yStride +
                  (long)((1 - pTVar1->xTileCoords) * tileRange.min.x) * xStride;
        copyFromFrameBuffer(&writePtr,&readPtr,readPtr + xStride * (lVar10 - lVar8),xStride,
                            pDVar3->format,pTVar1->type);
      }
      uVar11 = uVar11 + 1;
    }
  }
  pTVar2 = this->_tileBuffer;
  puVar5 = (uint *)(pTVar2->sampleCount)._sizeY;
  plVar6 = (long *)pTVar2->buffer;
  *(int *)&pTVar2->uncompressedData = (int)writePtr - (int)puVar5;
  (pTVar2->sampleCount)._data = puVar5;
  if (plVar6 != (long *)0x0) {
    local_38 = tileRange.max.x;
    local_34 = tileRange.max.y;
    iVar9 = (**(code **)(*plVar6 + 0x28))();
    pTVar2 = this->_tileBuffer;
    if (iVar9 < *(int *)&pTVar2->uncompressedData) {
      *(int *)&pTVar2->uncompressedData = iVar9;
      (pTVar2->sampleCount)._data = (uint *)compPtr;
    }
    else {
      pDVar3 = this->_ofd;
      if (pDVar3->format == NATIVE) {
        readPtr = (char *)(pTVar2->sampleCount)._sizeY;
        iVar9 = -1;
        if (-1 < iVar7) {
          iVar9 = iVar7;
        }
        local_48[0] = readPtr;
        for (iVar7 = 0; iVar7 != iVar9 + 1; iVar7 = iVar7 + 1) {
          uVar11 = 0;
          while( true ) {
            pTVar4 = (pDVar3->slices).
                     super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pDVar3->slices).
                               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x30) <=
                (ulong)uVar11) break;
            convertInPlace(&readPtr,local_48,pTVar4[uVar11].type,numPixels);
            uVar11 = uVar11 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
        // into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
            _ofd->tileDesc,
            _ofd->minX,
            _ofd->maxX,
            _ofd->minY,
            _ofd->maxY,
            _tileBuffer->tileCoord.dx,
            _tileBuffer->tileCoord.dy,
            _tileBuffer->tileCoord.lx,
            _tileBuffer->tileCoord.ly);

        int numScanLines = tileRange.max.y - tileRange.min.y + 1;
        //        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;

        //
        // Get the bytes for each line.
        //

        vector<uint64_t> bytesPerLine (_ofd->tileDesc.ySize);
        vector<int>      xOffsets (_ofd->slices.size ());
        vector<int>      yOffsets (_ofd->slices.size ());
        for (size_t i = 0; i < _ofd->slices.size (); i++)
        {
            const TOutSliceInfo& slice = *_ofd->slices[i];
            xOffsets[i]                = slice.xTileCoords * tileRange.min.x;
            yOffsets[i]                = slice.yTileCoords * tileRange.min.y;
        }

        calculateBytesPerLine (
            _ofd->header,
            _ofd->sampleCountSliceBase,
            _ofd->sampleCountXStride,
            _ofd->sampleCountYStride,
            tileRange.min.x,
            tileRange.max.x,
            tileRange.min.y,
            tileRange.max.y,
            xOffsets,
            yOffsets,
            bytesPerLine);

        //
        // Allocate the memory for internal buffer.
        // (TODO) more efficient memory management?
        //

        uint64_t totalBytes          = 0;
        uint64_t maxBytesPerTileLine = 0;
        for (size_t i = 0; i < bytesPerLine.size (); i++)
        {
            totalBytes += bytesPerLine[i];
            if (bytesPerLine[i] > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine[i];
        }
        _tileBuffer->buffer.resizeErase (static_cast<long> (totalBytes));

        char* writePtr = _tileBuffer->buffer;

        //
        // Iterate over the scan lines in the tile.
        //

        int xOffsetForSampleCount =
            (_ofd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
        int yOffsetForSampleCount =
            (_ofd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                const TOutSliceInfo& slice = *_ofd->slices[i];

                //
                // Fill the tile buffer with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        bytesPerLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //

                    int xOffsetForData = slice.xTileCoords ? tileRange.min.x
                                                           : 0;
                    int yOffsetForData = slice.yTileCoords ? tileRange.min.y
                                                           : 0;

                    // (TODO) treat sample count offsets differently.
                    copyFromDeepFrameBuffer (
                        writePtr,
                        slice.base,
                        _ofd->sampleCountSliceBase,
                        _ofd->sampleCountXStride,
                        _ofd->sampleCountYStride,
                        y,
                        tileRange.min.x,
                        tileRange.max.x,
                        xOffsetForSampleCount,
                        yOffsetForSampleCount,
                        xOffsetForData,
                        yOffsetForData,
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        _ofd->format,
                        slice.type);
#if defined(DEBUG)
                    assert (writePtr - _tileBuffer->buffer <= totalBytes);
#endif
                }
            }
        }

        //
        // Compress the pixel sample count table.
        //

        char*    ptr           = _tileBuffer->sampleCountTableBuffer;
        uint64_t tableDataSize = 0;
        for (int i = tileRange.min.y; i <= tileRange.max.y; i++)
        {
            int count = 0;
            for (int j = tileRange.min.x; j <= tileRange.max.x; j++)
            {
                count += _ofd->getSampleCount (
                    j - xOffsetForSampleCount, i - yOffsetForSampleCount);
                Xdr::write<CharPtrIO> (ptr, count);
                tableDataSize += sizeof (int);
            }
        }

        if (_tileBuffer->sampleCountTableCompressor)
        {
            _tileBuffer->sampleCountTableSize =
                _tileBuffer->sampleCountTableCompressor->compress (
                    _tileBuffer->sampleCountTableBuffer,
                    static_cast<int> (tableDataSize),
                    tileRange.min.y,
                    _tileBuffer->sampleCountTablePtr);
        }

        //
        // If we can't make data shrink (or compression was disabled), then just use the raw data.
        //

        if (!_tileBuffer->sampleCountTableCompressor ||
            _tileBuffer->sampleCountTableSize >= _ofd->maxSampleCountTableSize)
        {
            _tileBuffer->sampleCountTableSize = _ofd->maxSampleCountTableSize;
            _tileBuffer->sampleCountTablePtr =
                _tileBuffer->sampleCountTableBuffer;
        }

        //
        // Compress the contents of the tileBuffer,
        // and store the compressed data in the output file.
        //

        _tileBuffer->dataSize         = writePtr - _tileBuffer->buffer;
        _tileBuffer->uncompressedSize = _tileBuffer->dataSize;
        _tileBuffer->dataPtr          = _tileBuffer->buffer;

        // (TODO) don't do this all the time.
        if (_tileBuffer->compressor != 0) delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor (
            _ofd->header.compression (),
            maxBytesPerTileLine,
            _ofd->tileDesc.ySize,
            _ofd->header);

        if (_tileBuffer->compressor)
        {
            const char* compPtr;

            uint64_t compSize = _tileBuffer->compressor->compressTile (
                _tileBuffer->dataPtr,
                static_cast<int> (_tileBuffer->dataSize),
                tileRange,
                compPtr);

            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //

                convertToXdr (
                    _ofd, _tileBuffer->buffer, numScanLines, bytesPerLine);
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}